

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O1

double dznrm2(int n,complex<double> *x,int incx)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = 0.0;
  if (0 < incx && 0 < n) {
    pdVar1 = (double *)(x->_M_value + 8);
    dVar2 = 1.0;
    dVar4 = 0.0;
    do {
      dVar3 = pdVar1[-1];
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        dVar3 = ABS(dVar3);
        if (dVar3 <= dVar4) {
          dVar2 = dVar2 + (dVar3 / dVar4) * (dVar3 / dVar4);
        }
        else {
          dVar2 = dVar2 * (dVar4 / dVar3) * (dVar4 / dVar3) + 1.0;
          dVar4 = dVar3;
        }
      }
      dVar3 = *pdVar1;
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        dVar3 = ABS(dVar3);
        if (dVar3 <= dVar4) {
          dVar2 = dVar2 + (dVar3 / dVar4) * (dVar3 / dVar4);
        }
        else {
          dVar2 = dVar2 * (dVar4 / dVar3) * (dVar4 / dVar3) + 1.0;
          dVar4 = dVar3;
        }
      }
      pdVar1 = pdVar1 + (ulong)(uint)incx * 2;
      n = n + -1;
    } while (n != 0);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar4 = dVar4 * dVar2;
  }
  return dVar4;
}

Assistant:

double dznrm2 ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DZNRM2 returns the euclidean norm of a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    DZNRM2 := sqrt ( sum ( conjg ( x(1:n) ) * x(1:n) ) )
//            = sqrt ( dot_product ( x(1:n), x(1:n) ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, double DZNRM2, the norm of the vector.
//
{
  int i;
  int ix;
  double scale;
  double ssq;
  double temp;
  double value;

  if ( n < 1 || incx < 1 )
  {
    value  = 0.0;
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( real ( x[ix] ) != 0.0 )
      {
        temp = fabs ( real ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }

      if ( imag ( x[ix] ) != 0.0 )
      {
        temp = fabs ( imag ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }
      ix = ix + incx;
    }
    value  = scale * sqrt ( ssq );
  }
  return value;
}